

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_client.hpp
# Opt level: O3

void __thiscall
rest_rpc::rpc_client::async_call<0ul,std::__cxx11::string&>
          (rpc_client *this,string *rpc_name,
          function<void_(std::error_code,_nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>)>
          *cb,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  char *pcVar1;
  char *message;
  ulong uVar2;
  undefined8 uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_00;
  long lVar4;
  pointer *__ptr;
  buffer_type ret;
  unique_lock<std::mutex> lock;
  undefined1 local_71;
  buffer_type local_70;
  ulong local_58;
  undefined1 local_50 [24];
  zone *local_38;
  unsigned_long local_30;
  
  if (((this->has_connected_)._M_base._M_i & 1U) == 0) {
    if ((cb->super__Function_base)._M_manager != (_Manager_type)0x0) {
      if (asio::system_category()::instance == '\0') {
        async_call<0ul,std::__cxx11::string&>();
      }
      local_50._0_4_ = 0x6b;
      local_50._8_8_ = &asio::system_category()::instance;
      local_70.m_size = 0x1929e6;
      local_70.m_data = (char *)0xd;
      if ((cb->super__Function_base)._M_manager == (_Manager_type)0x0) {
        uVar3 = std::__throw_bad_function_call();
        _Unwind_Resume(uVar3);
      }
      (*cb->_M_invoker)((_Any_data *)cb,(error_code *)local_50,
                        (basic_string_view<char,_std::char_traits<char>_> *)&local_70);
    }
  }
  else {
    local_50._0_8_ = &this->cb_mtx_;
    local_50._8_8_ = local_50._8_8_ & 0xffffffffffffff00;
    std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_50);
    local_50[8] = true;
    local_58 = this->callback_id_ + 1 | 0x8000000000000000;
    this->callback_id_ = local_58;
    local_30 = 0;
    std::__shared_ptr<rest_rpc::rpc_client::call_t,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<rest_rpc::rpc_client::call_t>,asio::io_context&,std::function<void(std::error_code,nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>)>,unsigned_long>
              ((__shared_ptr<rest_rpc::rpc_client::call_t,(__gnu_cxx::_Lock_policy)2> *)&local_70,
               (allocator<rest_rpc::rpc_client::call_t> *)&local_71,&this->ios_,cb,&local_30);
    call_t::start_timer((call_t *)local_70.m_size);
    std::
    _Hashtable<unsigned_long,std::pair<unsigned_long_const,std::shared_ptr<rest_rpc::rpc_client::call_t>>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<rest_rpc::rpc_client::call_t>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<unsigned_long&,std::shared_ptr<rest_rpc::rpc_client::call_t>&>
              ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,std::shared_ptr<rest_rpc::rpc_client::call_t>>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<rest_rpc::rpc_client::call_t>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&this->callback_map_,&local_58,&local_70);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70.m_data !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70.m_data);
    }
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_50);
    local_50._0_8_ = local_50._0_8_ & 0xffffffff00000000;
    local_38 = (zone *)0x0;
    rpc_service::msgpack_codec::pack_args<std::__cxx11::string&>
              (&local_70,(msgpack_codec *)args,args_00);
    uVar2 = local_58;
    message = (rpc_name->_M_dataplus)._M_p;
    lVar4 = 0;
    do {
      pcVar1 = message + lVar4;
      lVar4 = lVar4 + 1;
    } while (*pcVar1 != '\0');
    MD5::MD5CE::ProcessMessage(message,(int)lVar4 - 1);
    write(this,(int)uVar2,(void *)0x0,(size_t)&local_70);
    free(local_70.m_data);
    if (local_38 != (zone *)0x0) {
      std::default_delete<msgpack::v1::zone>::operator()
                ((default_delete<msgpack::v1::zone> *)&local_38,local_38);
    }
  }
  return;
}

Assistant:

void async_call(const std::string &rpc_name,
                  std::function<void(asio::error_code, string_view)> cb,
                  Args &&...args) {
    if (!has_connected_) {
      if (cb)
        cb(asio::error::make_error_code(asio::error::not_connected),
           "not connected");
      return;
    }

    uint64_t cb_id = 0;
    {
      std::unique_lock<std::mutex> lock(cb_mtx_);
      callback_id_++;
      callback_id_ |= (uint64_t(1) << 63);
      cb_id = callback_id_;
      auto call = std::make_shared<call_t>(ios_, std::move(cb), TIMEOUT);
      call->start_timer();
      callback_map_.emplace(cb_id, call);
    }

    rpc_service::msgpack_codec codec;
    auto ret = codec.pack_args(std::forward<Args>(args)...);
    write(cb_id, request_type::req_res, std::move(ret),
          MD5::MD5Hash32(rpc_name.data()));
  }